

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

Nullable<CordRep_*> absl::VerifyTree(Nullable<CordRep_*> node)

{
  byte bVar1;
  reference ppCVar2;
  Nonnull<CordRep_*> in_RCX;
  int iVar3;
  Nonnull<CordRep_*> unaff_R14;
  string death_message;
  InlinedVector<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
  worklist;
  string local_90;
  string local_70 [32];
  ulong local_50;
  void *local_48;
  long local_40;
  Nullable<CordRep_*> local_38;
  
  if (node != (Nullable<CordRep_*>)0x0) {
    local_50 = 0;
    local_38 = node;
    inlined_vector_internal::
    Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>::
    EmplaceBack<absl::cord_internal::CordRep*const&>
              ((Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>
                *)&local_50,&local_38);
    do {
      ppCVar2 = InlinedVector<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
                ::back((InlinedVector<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
                        *)&local_50);
      if (local_50 < 2) {
        VerifyTree();
LAB_0012eb82:
        VerifyTree();
LAB_0012eb8f:
        std::__cxx11::string::string<std::allocator<char>>
                  (local_70,"Check node->length != 0 failed: ",(allocator<char> *)&local_90);
        ReportError_abi_cxx11_(&local_90,(absl *)node,unaff_R14,in_RCX);
        std::__cxx11::string::operator+=(local_70,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                  (3,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                   ,0x5f5,local_70);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                      ,0x5f5,
                      "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)");
      }
      unaff_R14 = *ppCVar2;
      local_50 = local_50 - 2;
      if (unaff_R14 == (Nonnull<CordRep_*>)0x0) goto LAB_0012eb82;
      if (unaff_R14 == node) {
        bVar1 = unaff_R14->tag;
      }
      else {
        if (unaff_R14->length == 0) goto LAB_0012eb8f;
        bVar1 = unaff_R14->tag;
        if (bVar1 == 2) {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_70,"Check !node->IsCrc() failed: ",(allocator<char> *)&local_90);
          ReportError_abi_cxx11_(&local_90,(absl *)node,unaff_R14,in_RCX);
          std::__cxx11::string::operator+=(local_70,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5f6,local_70);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5f6,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
      }
      if (bVar1 < 6) {
        if (bVar1 == 1) {
          in_RCX = (Nonnull<CordRep_*>)**(ulong **)&unaff_R14[1].refcount;
          if (in_RCX <= (Nonnull<CordRep_*>)unaff_R14[1].length) {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_70,
                       "Check node->substring()->start < node->substring()->child->length failed: ",
                       (allocator<char> *)&local_90);
            ReportError_abi_cxx11_(&local_90,(absl *)node,unaff_R14,in_RCX);
            std::__cxx11::string::operator+=(local_70,(string *)&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                      (3,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                       ,0x602,local_70);
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                          ,0x602,
                          "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                         );
          }
          if (in_RCX < (Nonnull<CordRep_*>)
                       (((Nonnull<CordRep_*>)unaff_R14[1].length)->storage +
                       (unaff_R14->length - 0xd))) {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_70,
                       "Check node->substring()->start + node->length <= node->substring()->child->length failed: "
                       ,(allocator<char> *)&local_90);
            ReportError_abi_cxx11_(&local_90,(absl *)node,unaff_R14,in_RCX);
            std::__cxx11::string::operator+=(local_70,(string *)&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                      (3,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                       ,0x605,local_70);
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                          ,0x605,
                          "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                         );
          }
        }
        else if (bVar1 == 2) {
          in_RCX = (Nonnull<CordRep_*>)unaff_R14[1].length;
          if (in_RCX == (Nonnull<CordRep_*>)0x0) {
            if (unaff_R14->length != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        (local_70,
                         "Check node->crc()->child != nullptr || node->crc()->length == 0 failed: ",
                         (allocator<char> *)&local_90);
              ReportError_abi_cxx11_(&local_90,(absl *)node,unaff_R14,in_RCX);
              std::__cxx11::string::operator+=(local_70,(string *)&local_90);
              std::__cxx11::string::~string((string *)&local_90);
              (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                        (3,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                         ,0x609,local_70);
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                            ,0x609,
                            "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                           );
            }
          }
          else {
            if (unaff_R14->length != in_RCX->length) {
              std::__cxx11::string::string<std::allocator<char>>
                        (local_70,"Check node->crc()->length == node->crc()->child->length failed: "
                         ,(allocator<char> *)&local_90);
              ReportError_abi_cxx11_(&local_90,(absl *)node,unaff_R14,in_RCX);
              std::__cxx11::string::operator+=(local_70,(string *)&local_90);
              std::__cxx11::string::~string((string *)&local_90);
              (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                        (3,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                         ,0x60c,local_70);
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                            ,0x60c,
                            "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)"
                           );
            }
            unaff_R14 = unaff_R14 + 1;
            inlined_vector_internal::
            Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>
            ::EmplaceBack<absl::cord_internal::CordRep*const&>
                      ((Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>
                        *)&local_50,(CordRep **)unaff_R14);
          }
        }
        else if ((bVar1 == 5) && (unaff_R14[1].length == 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_70,"Check node->external()->base != nullptr failed: ",
                     (allocator<char> *)&local_90);
          ReportError_abi_cxx11_(&local_90,(absl *)node,unaff_R14,in_RCX);
          std::__cxx11::string::operator+=(local_70,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5fe,local_70);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5fe,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
      }
      else {
        if (0xf8 < bVar1) {
          __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                        ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
        }
        in_RCX = (Nonnull<CordRep_*>)0xc;
        if (bVar1 < 0xbb) {
          in_RCX = (Nonnull<CordRep_*>)0x6;
        }
        iVar3 = -0xb800d;
        if (bVar1 < 0xbb) {
          iVar3 = -0xe8d;
        }
        if (bVar1 < 0x43) {
          in_RCX = (Nonnull<CordRep_*>)0x3;
          iVar3 = -0x1d;
        }
        if ((ulong)(long)(int)(((uint)bVar1 << (sbyte)in_RCX) + iVar3) < unaff_R14->length) {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_70,"Check node->length <= node->flat()->Capacity() failed: ",
                     (allocator<char> *)&local_90);
          ReportError_abi_cxx11_(&local_90,(absl *)node,unaff_R14,in_RCX);
          std::__cxx11::string::operator+=(local_70,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                    (3,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                     ,0x5fb,local_70);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x5fb,
                        "bool absl::VerifyNode(absl::Nonnull<CordRep *>, absl::Nonnull<CordRep *>)")
          ;
        }
      }
    } while (1 < local_50);
    if (local_50 != 0) {
      operator_delete(local_48,local_40 << 3);
    }
  }
  return node;
}

Assistant:

static inline absl::Nullable<CordRep*> VerifyTree(
    absl::Nullable<CordRep*> node) {
  assert(node == nullptr || VerifyNode(node, node));
  static_cast<void>(&VerifyNode);
  return node;
}